

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  _Ios_Seekdir _Var5;
  long *plVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  long lVar8;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  string_view name_01;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar9;
  char c;
  cmCommand *local_2f8;
  undefined4 local_2ec;
  string output;
  char hex [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  Arguments arguments;
  string fileName;
  ifstream file;
  byte abStack_218 [488];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2f8 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"READ must be called with at least two additional arguments",
               (allocator<char> *)&arguments);
    cmCommand::SetError(local_2f8,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    local_2ec = 0;
  }
  else {
    if (HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::parser == '\0') {
      iVar4 = __cxa_guard_acquire(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser);
      if (iVar4 != 0) {
        arguments.Offset._M_dataplus._M_p = (pointer)0x0;
        arguments.Offset._M_string_length = 0;
        arguments.Offset.field_2._M_allocated_capacity = 0;
        name.super_string_view._M_str = "OFFSET";
        name.super_string_view._M_len = 6;
        cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)&arguments,name,0);
        name_00.super_string_view._M_str = "LIMIT";
        name_00.super_string_view._M_len = 5;
        cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)&arguments,name_00,0x20);
        _file = (cmArgumentParser<Arguments> *)0x40;
        name_01._M_str = "HEX";
        name_01._M_len = 3;
        pVar9 = ArgumentParser::ActionMap::Emplace((ActionMap *)&arguments,name_01,(Action *)&file);
        std::_Function_base::~_Function_base((_Function_base *)&file);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                        ,0x4b,
                        "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = bool]"
                       );
        }
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)&HandleReadCommand::parser,
                 (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)&arguments);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                   *)&arguments);
        __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadCommand::parser,
                     &__dso_handle);
        __cxa_guard_release(&HandleReadCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                             ::parser);
      }
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    arguments.Offset._M_dataplus._M_p = (pointer)&arguments.Offset.field_2;
    arguments.Offset._M_string_length = 0;
    arguments.Offset.field_2._M_allocated_capacity =
         arguments.Offset.field_2._M_allocated_capacity & 0xffffffffffffff00;
    arguments.Limit._M_dataplus._M_p = (pointer)&arguments.Limit.field_2;
    arguments.Limit._M_string_length = 0;
    arguments.Limit.field_2._M_local_buf[0] = '\0';
    arguments.Hex = false;
    _file = &HandleReadCommand::parser;
    for (pbVar7 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 3; pbVar7 != pbVar2;
        pbVar7 = pbVar7 + 1) {
      arg._M_str = (pbVar7->_M_dataplus)._M_p;
      arg._M_len = pbVar7->_M_string_length;
      ArgumentParser::Instance::Consume
                ((Instance *)&file,arg,&arguments,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0);
    }
    std::__cxx11::string::string((string *)&fileName,(string *)(pbVar1 + 1));
    bVar3 = cmsys::SystemTools::FileIsFullPath(&fileName);
    if (!bVar3) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_2f8->Makefile);
      std::__cxx11::string::_M_assign((string *)&fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,"/",
                     pbVar1 + 1);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&file);
    }
    std::ifstream::ifstream(&file,fileName._M_dataplus._M_p,_S_in);
    lVar8 = (long)(((cmArgumentParser<Arguments> *)((long)_file + -0x18))->Bindings).
                  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  .
                  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = (abStack_218[lVar8] & 5) == 0;
    local_2ec = (undefined4)CONCAT71((int7)((ulong)lVar8 >> 8),bVar3);
    if (bVar3) {
      if (arguments.Limit._M_string_length == 0) {
        lVar8 = -1;
      }
      else {
        iVar4 = atoi(arguments.Limit._M_dataplus._M_p);
        lVar8 = (long)iVar4;
      }
      if (arguments.Offset._M_string_length == 0) {
        _Var5 = _S_beg;
      }
      else {
        _Var5 = atoi(arguments.Offset._M_dataplus._M_p);
      }
      std::istream::seekg((long)&file,_Var5);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      if (arguments.Hex == true) {
        for (; lVar8 != 0; lVar8 = lVar8 - (ulong)(0 < lVar8)) {
          plVar6 = (long *)std::istream::get((char *)&file);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
          sprintf(hex,"%.2x",(ulong)(byte)c);
          std::__cxx11::string::append((char *)&output);
        }
      }
      else {
        _hex = (pointer)&local_2b8;
        local_2b8._M_local_buf[0] = '\0';
        c = '\0';
        while (lVar8 != 0) {
          bVar3 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&file,(string *)hex,(bool *)&c,lVar8);
          if (!bVar3) break;
          if ((0 < lVar8) && (lVar8 = lVar8 - (ulong)(byte)c, lVar8 < 1)) {
            lVar8 = 0;
          }
          std::__cxx11::string::append((string *)&output);
          if (c == '\x01') {
            std::__cxx11::string::append((char *)&output);
          }
        }
        std::__cxx11::string::~string((string *)hex);
      }
      cmMakefile::AddDefinition(local_2f8->Makefile,pbVar1 + 2,output._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"failed to open for reading (",(allocator<char> *)hex);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)hex);
      std::__cxx11::string::append((char *)&output);
      std::__cxx11::string::append((string *)&output);
      cmCommand::SetError(local_2f8,&output);
    }
    std::__cxx11::string::~string((string *)&output);
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&fileName);
    HandleReadCommand::Arguments::~Arguments(&arguments);
  }
  return SUB41(local_2ec,0);
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileNameArg = args[1];
  std::string const& variable = args[2];

  struct Arguments
  {
    std::string Offset;
    std::string Limit;
    bool Hex = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("OFFSET"_s, &Arguments::Offset)
                               .Bind("LIMIT"_s, &Arguments::Limit)
                               .Bind("HEX"_s, &Arguments::Hex);

  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(3));

  std::string fileName = fileNameArg;
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg;
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(),
                       arguments.Hex ? (std::ios::binary | std::ios::in)
                                     : std::ios::in);
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }

  // is there a limit?
  long sizeLimit = -1;
  if (!arguments.Limit.empty()) {
    sizeLimit = atoi(arguments.Limit.c_str());
  }

  // is there an offset?
  long offset = 0;
  if (!arguments.Offset.empty()) {
    offset = atoi(arguments.Offset.c_str());
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (arguments.Hex) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit != 0) && (file.get(c))) {
      char hex[4];
      sprintf(hex, "%.2x", c & 0xff);
      output += hex;
      if (sizeLimit > 0) {
        sizeLimit--;
      }
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit != 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      if (sizeLimit > 0) {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline) {
          sizeLimit--;
        }
        if (sizeLimit < 0) {
          sizeLimit = 0;
        }
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}